

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

void __thiscall upb::generator::Output::Write(Output *this,string_view data)

{
  basic_string_view<char,_std::char_traits<char>_> *this_00;
  string_view pc;
  string_view text;
  bool bVar1;
  size_type __n;
  basic_string_view<char,_std::char_traits<char>_> bVar2;
  AlphaNum local_188;
  undefined1 local_158 [16];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_148;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_128;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *local_108;
  undefined8 local_100;
  Output *local_f8;
  size_t sStack_f0;
  string local_e0 [39];
  allocator<char> local_b9;
  undefined1 local_b8 [8];
  string last_line_prefix;
  basic_string_view<char,_std::char_traits<char>_> line_prefix;
  basic_string_view<char,_std::char_traits<char>_> local_78;
  size_type local_68;
  size_t indent;
  Output *local_50;
  char *local_48;
  string local_40 [8];
  string stripped;
  Output *this_local;
  string_view data_local;
  
  data_local._M_len = (size_t)data._M_str;
  this_local = (Output *)data._M_len;
  stripped.field_2._8_8_ = this;
  std::__cxx11::string::string(local_40);
  local_50 = this_local;
  local_48 = (char *)data_local._M_len;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&indent,"\n ");
  text._M_str = local_48;
  text._M_len = (size_t)local_50;
  bVar1 = absl::lts_20240722::StartsWith(text,_indent);
  if (bVar1) {
    local_78 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                         ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,1,
                          0xffffffffffffffff);
    local_68 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_not_of
                         (&local_78,' ',0);
    if (local_68 != 0xffffffffffffffff) {
      bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                        ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,0,
                         local_68 + 1);
      last_line_prefix.field_2._8_8_ = bVar2._M_len;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)local_b8,
                 (basic_string_view<char,_std::char_traits<char>_> *)
                 ((long)&last_line_prefix.field_2 + 8),&local_b9);
      std::allocator<char>::~allocator(&local_b9);
      std::__cxx11::string::size();
      std::__cxx11::string::resize((ulong)local_b8);
      this_00 = (basic_string_view<char,_std::char_traits<char>_> *)
                ((long)&last_line_prefix.field_2 + 8);
      __n = std::basic_string_view<char,_std::char_traits<char>_>::size(this_00);
      std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,__n);
      local_f8 = this_local;
      sStack_f0 = data_local._M_len;
      std::
      pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
      ::pair<std::basic_string_view<char,_std::char_traits<char>_>_&,_const_char_(&)[2],_true>
                (&local_148,this_00,(char (*) [2])0x173bea);
      std::
      pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_char_(&)[2],_true>
                (&local_128,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
                 (char (*) [2])0x173bea);
      local_108 = &local_148;
      local_100 = 2;
      absl::lts_20240722::StrReplaceAll_abi_cxx11_(local_e0,local_f8,sStack_f0,local_108,2);
      std::__cxx11::string::operator=(local_40,local_e0);
      std::__cxx11::string::~string(local_e0);
      local_158 = std::__cxx11::string::operator_cast_to_basic_string_view(local_40);
      data_local._M_len = local_158._8_8_;
      this_local = local_158._0_8_;
      std::__cxx11::string::~string((string *)local_b8);
    }
  }
  pc._M_str = (char *)data_local._M_len;
  pc._M_len = (size_t)this_local;
  absl::lts_20240722::AlphaNum::AlphaNum(&local_188,pc);
  absl::lts_20240722::StrAppend((string *)this,&local_188);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void Write(absl::string_view data) {
    std::string stripped;
    if (absl::StartsWith(data, "\n ")) {
      size_t indent = data.substr(1).find_first_not_of(' ');
      if (indent != absl::string_view::npos) {
        // Remove indentation from all lines.
        auto line_prefix = data.substr(0, indent + 1);
        // The final line has an extra newline and is indented two less, eg.
        //    R"cc(
        //      UPB_INLINE $0 $1_$2(const $1 *msg) {
        //        return $1_has_$2(msg) ? *UPB_PTR_AT(msg, $3, $0) : $4;
        //      }
        //    )cc",
        std::string last_line_prefix = std::string(line_prefix);
        last_line_prefix.resize(last_line_prefix.size() - 2);
        data.remove_prefix(line_prefix.size());
        stripped = absl::StrReplaceAll(
            data, {{line_prefix, "\n"}, {last_line_prefix, "\n"}});
        data = stripped;
      }
    }
    absl::StrAppend(&output_, data);
  }